

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

void Vaxpy_Serial(sunrealtype a,N_Vector x,N_Vector y)

{
  N_Vector p_Var1;
  long in_RDX;
  sunrealtype *yd;
  
  if ((a != 1.0) || (NAN(a))) {
    if ((a != -1.0) || (NAN(a))) {
      if (0 < (long)x) {
        p_Var1 = (N_Vector)0x0;
        do {
          *(double *)(in_RDX + (long)p_Var1 * 8) =
               (double)(&y->content)[(long)p_Var1] * a + *(double *)(in_RDX + (long)p_Var1 * 8);
          p_Var1 = (N_Vector)((long)&p_Var1->content + 1);
        } while (x != p_Var1);
      }
    }
    else if (0 < (long)x) {
      p_Var1 = (N_Vector)0x0;
      do {
        *(double *)(in_RDX + (long)p_Var1 * 8) =
             *(double *)(in_RDX + (long)p_Var1 * 8) - (double)(&y->content)[(long)p_Var1];
        p_Var1 = (N_Vector)((long)&p_Var1->content + 1);
      } while (x != p_Var1);
    }
  }
  else if (0 < (long)x) {
    p_Var1 = (N_Vector)0x0;
    do {
      *(double *)(in_RDX + (long)p_Var1 * 8) =
           (double)(&y->content)[(long)p_Var1] + *(double *)(in_RDX + (long)p_Var1 * 8);
      p_Var1 = (N_Vector)((long)&p_Var1->content + 1);
    } while (x != p_Var1);
  }
  return;
}

Assistant:

static void Vaxpy_Serial(sunrealtype a, N_Vector x, N_Vector y)
{
  sunindextype i, N;
  sunrealtype *xd, *yd;

  xd = yd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  yd = NV_DATA_S(y);

  if (a == ONE)
  {
    for (i = 0; i < N; i++) { yd[i] += xd[i]; }
    return;
  }

  if (a == -ONE)
  {
    for (i = 0; i < N; i++) { yd[i] -= xd[i]; }
    return;
  }

  for (i = 0; i < N; i++) { yd[i] += a * xd[i]; }

  return;
}